

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QRect __thiscall
QMainWindowLayout::dockWidgetAreaRect
          (QMainWindowLayout *this,DockWidgetArea area,DockWidgetAreaSize size)

{
  bool bVar1;
  DockPosition DVar2;
  QDebug *o;
  int in_EDX;
  DockWidgetArea in_ESI;
  QDockAreaLayout *in_RDI;
  long in_FS_OFFSET;
  DockPosition dockPosition;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QDockAreaLayout dl;
  QLoggingCategory *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  undefined4 in_stack_fffffffffffffd58;
  DockWidgetArea in_stack_fffffffffffffd5c;
  undefined4 in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd98;
  DockPosition in_stack_fffffffffffffda4;
  QDebug in_stack_fffffffffffffda8;
  QDebug local_250;
  QRect local_248;
  undefined1 *local_238;
  undefined1 *local_230;
  undefined1 local_228 [104];
  undefined8 auStack_1c0 [55];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  DVar2 = toDockPos(in_ESI);
  if (DVar2 == DockCount) {
    local_238 = &DAT_aaaaaaaaaaaaaaaa;
    local_230 = &DAT_aaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcQpaDockWidgets();
    anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
               CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd48);
    while( true ) {
      bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                        ((QLoggingCategoryMacroHolder *)&local_238);
      if (!bVar1) break;
      anon_unknown.dwarf_ad8df2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x5f6701);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_RDI,
                 (char *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 in_stack_fffffffffffffd54,(char *)in_stack_fffffffffffffd48,(char *)0x5f6717);
      QMessageLogger::debug();
      o = QDebug::operator<<((QDebug *)CONCAT44(DVar2,in_stack_fffffffffffffd68),
                             in_stack_fffffffffffffd98);
      QDebug::QDebug((QDebug *)&stack0xfffffffffffffda8,o);
      ::operator<<((QDebug *)in_RDI,in_stack_fffffffffffffd5c);
      QDebug::~QDebug(&local_250);
      QDebug::~QDebug((QDebug *)&stack0xfffffffffffffda8);
      QDebug::~QDebug((QDebug *)&stack0xfffffffffffffda0);
      local_230 = (undefined1 *)((ulong)local_230 & 0xffffffffffffff00);
    }
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  }
  else {
    memset(local_228,0xaa,0x220);
    QDockAreaLayout::QDockAreaLayout
              ((QDockAreaLayout *)CONCAT44(in_ESI,in_EDX),
               (QDockAreaLayout *)CONCAT44(DVar2,in_stack_fffffffffffffd68));
    if (in_EDX == 1) {
      local_248 = QDockAreaLayout::gapRect
                            ((QDockAreaLayout *)in_stack_fffffffffffffda8.stream,
                             in_stack_fffffffffffffda4);
    }
    else {
      local_248._8_8_ = auStack_1c0[(ulong)DVar2 * 0xe + 1];
      local_248._0_8_ = auStack_1c0[(ulong)DVar2 * 0xe];
    }
    QDockAreaLayout::~QDockAreaLayout(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_248;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayout::dockWidgetAreaRect(const Qt::DockWidgetArea area, DockWidgetAreaSize size) const
{
    const QInternal::DockPosition dockPosition = toDockPos(area);

    // Called with invalid dock widget area
    if (dockPosition == QInternal::DockCount) {
        qCDebug(lcQpaDockWidgets) << "QMainWindowLayout::dockWidgetAreaRect called with" << area;
        return QRect();
    }

    const QDockAreaLayout dl = layoutState.dockAreaLayout;

    // Return maximum or visible rectangle
    return (size == Maximum) ? dl.gapRect(dockPosition) : dl.docks[dockPosition].rect;
}